

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  JSValue v;
  JSValue v_00;
  int iVar1;
  JSValue *pJVar2;
  JSValue *tab;
  int *piVar3;
  JSContext *in_RDI;
  JSContext *in_R9;
  JSValue JVar4;
  JSValue args [2];
  list_head *el;
  JSMapRecord *mr;
  JSMapState *s;
  JSMapIteratorData *it;
  JSMapRecord *in_stack_ffffffffffffff68;
  JSContext *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar5;
  JSClassID in_stack_ffffffffffffff7c;
  undefined4 uVar6;
  JSContext *in_stack_ffffffffffffff80;
  int64_t iVar7;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined1 *local_60;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar4.tag._0_4_ = in_stack_ffffffffffffff90;
  JVar4.u = (JSValueUnion)in_stack_ffffffffffffff88;
  JVar4.tag._4_4_ = in_stack_ffffffffffffff94;
  pJVar2 = (JSValue *)JS_GetOpaque2(in_stack_ffffffffffffff80,JVar4,in_stack_ffffffffffffff7c);
  if (pJVar2 == (JSValue *)0x0) {
    (in_R9->header).ref_count = 0;
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    iVar1 = JS_IsUndefined(*pJVar2);
    if (iVar1 == 0) {
      tab = (JSValue *)JS_GetOpaque(*pJVar2,(int)args[0].tag + 0x1f);
      if (pJVar2[1].tag == 0) {
        local_60 = (undefined1 *)tab[1].u.ptr;
      }
      else {
        local_60 = *(undefined1 **)(pJVar2[1].tag + 0x20);
        map_decref_record((JSRuntime *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      for (; (int64_t *)local_60 != &tab->tag; local_60 = *(undefined1 **)(local_60 + 8)) {
        piVar3 = (int *)(local_60 + -0x18);
        if (*(int *)(local_60 + -0x14) == 0) {
          *piVar3 = *piVar3 + 1;
          pJVar2[1].tag = (int64_t)piVar3;
          (in_R9->header).ref_count = 0;
          if (pJVar2[1].u.int32 == 0) {
            JVar4 = JS_DupValue(in_RDI,*(JSValue *)(local_60 + 0x20));
            return JVar4;
          }
          if ((int)args[0].tag == 0) {
            uVar5 = (undefined4)*(undefined8 *)(local_60 + 0x30);
            uVar6 = (undefined4)((ulong)*(undefined8 *)(local_60 + 0x30) >> 0x20);
            iVar7 = *(int64_t *)(local_60 + 0x38);
          }
          else {
            uVar5 = (undefined4)*(undefined8 *)(local_60 + 0x20);
            uVar6 = (undefined4)((ulong)*(undefined8 *)(local_60 + 0x20) >> 0x20);
            iVar7 = *(int64_t *)(local_60 + 0x28);
          }
          if (pJVar2[1].u.int32 == 1) {
            v_00.u._4_4_ = uVar6;
            v_00.u.int32 = uVar5;
            v_00.tag = iVar7;
            JVar4 = JS_DupValue(in_RDI,v_00);
            return JVar4;
          }
          JVar4 = js_create_array(in_R9,(int)((ulong)pJVar2 >> 0x20),tab);
          return JVar4;
        }
      }
      pJVar2[1].tag = 0;
      v.u._4_4_ = in_stack_ffffffffffffff7c;
      v.u.int32 = in_stack_ffffffffffffff78;
      v.tag = (int64_t)in_stack_ffffffffffffff80;
      JS_FreeValue(in_stack_ffffffffffffff70,v);
      (pJVar2->u).ptr = (void *)((ulong)in_stack_ffffffffffffff94 << 0x20);
      pJVar2->tag = 3;
    }
    (in_R9->header).ref_count = 1;
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 3;
  }
  return _local_10;
}

Assistant:

static JSValue js_map_iterator_next(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv,
                                    BOOL *pdone, int magic)
{
    JSMapIteratorData *it;
    JSMapState *s;
    JSMapRecord *mr;
    struct list_head *el;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP_ITERATOR + magic);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    s = JS_GetOpaque(it->obj, JS_CLASS_MAP + magic);
    assert(s != NULL);
    if (!it->cur_record) {
        el = s->records.next;
    } else {
        mr = it->cur_record;
        el = mr->link.next;
        map_decref_record(ctx->rt, mr); /* the record can be freed here */
    }
    for(;;) {
        if (el == &s->records) {
            /* no more record  */
            it->cur_record = NULL;
            JS_FreeValue(ctx, it->obj);
            it->obj = JS_UNDEFINED;
        done:
            /* end of enumeration */
            *pdone = TRUE;
            return JS_UNDEFINED;
        }
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty)
            break;
        /* get the next record */
        el = mr->link.next;
    }

    /* lock the record so that it won't be freed */
    mr->ref_count++;
    it->cur_record = mr;
    *pdone = FALSE;

    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_DupValue(ctx, mr->key);
    } else {
        JSValueConst args[2];
        args[0] = mr->key;
        if (magic)
            args[1] = mr->key;
        else
            args[1] = mr->value;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return JS_DupValue(ctx, args[1]);
        } else {
            return js_create_array(ctx, 2, args);
        }
    }
}